

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

bool __thiscall
BayesianGameWithClusterInfo::TestExactEquivalence
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  value_type vVar1;
  bool bVar2;
  Index IVar3;
  reference pvVar4;
  const_reference ppJVar5;
  value_type in_ECX;
  value_type in_EDX;
  long in_RDI;
  double dVar6;
  double p2_1;
  double p1_1;
  BeliefIteratorGeneric bit2;
  BeliefIteratorGeneric bit1;
  JointBeliefInterface *jb2;
  JointBeliefInterface *jb1;
  Index jtI2_2;
  Index jtI1_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2_2;
  bool equalJB;
  double conditional_pjt2;
  double conditional_pjt1;
  double pjt2;
  double pjt1;
  Index jtI2_1;
  Index jtI1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2_1;
  Index jtI2;
  Index jtI1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  bool equalProb;
  bool finished;
  double p2;
  double p1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  BayesianGameBase *in_stack_fffffffffffffd60;
  allocator_type *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  Index in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda8;
  Index in_stack_fffffffffffffdac;
  Index in_stack_fffffffffffffdb0;
  value_type in_stack_fffffffffffffdb4;
  byte local_231;
  byte local_1e1;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  value_type local_150;
  value_type local_148;
  Index local_140;
  Index local_13c;
  byte local_11e;
  undefined4 local_11c;
  undefined4 local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  Index local_d8;
  Index local_d4;
  undefined4 local_b4;
  Index local_98;
  Index local_94;
  byte local_73;
  bool local_72;
  undefined4 local_70;
  double local_48;
  double local_40;
  value_type local_1c;
  value_type local_18;
  byte local_1;
  
  local_1c = in_ECX;
  local_18 = in_EDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8bec11);
  local_48 = 0.0;
  local_40 = 0.0;
  (**(code **)(*(long *)(in_RDI + 0x20) + 0x18))(in_RDI + 0x20);
  local_70 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bec6c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffd80,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
             ,(value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8becc2);
  local_73 = 1;
  local_72 = false;
  while (((local_72 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffd60,
                        CONCAT17(in_stack_fffffffffffffd5f,
                                 CONCAT16(in_stack_fffffffffffffd5e,
                                          CONCAT15(in_stack_fffffffffffffd5d,
                                                   CONCAT14(in_stack_fffffffffffffd5c,
                                                            in_stack_fffffffffffffd58)))));
    if (*pvVar4 == local_18) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      vVar1 = local_1c;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffd60,
                          CONCAT17(in_stack_fffffffffffffd5f,
                                   CONCAT16(in_stack_fffffffffffffd5e,
                                            CONCAT15(in_stack_fffffffffffffd5d,
                                                     CONCAT14(in_stack_fffffffffffffd5c,
                                                              in_stack_fffffffffffffd58)))));
      *pvVar4 = vVar1;
      local_94 = BayesianGameBase::IndividualToJointTypeIndices
                           (in_stack_fffffffffffffd60,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT17(in_stack_fffffffffffffd5f,
                                     CONCAT16(in_stack_fffffffffffffd5e,
                                              CONCAT15(in_stack_fffffffffffffd5d,
                                                       CONCAT14(in_stack_fffffffffffffd5c,
                                                                in_stack_fffffffffffffd58)))));
      local_98 = BayesianGameBase::IndividualToJointTypeIndices
                           (in_stack_fffffffffffffd60,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT17(in_stack_fffffffffffffd5f,
                                     CONCAT16(in_stack_fffffffffffffd5e,
                                              CONCAT15(in_stack_fffffffffffffd5d,
                                                       CONCAT14(in_stack_fffffffffffffd5c,
                                                                in_stack_fffffffffffffd58)))));
      dVar6 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_94);
      local_40 = local_40 + dVar6;
      dVar6 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_98);
      local_48 = dVar6 + local_48;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    }
    local_72 = IndexTools::Increment(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  (**(code **)(*(long *)(in_RDI + 0x20) + 0x18))(in_RDI + 0x20);
  local_b4 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bef52);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffd80,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
             ,(value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8befa8);
  local_72 = false;
  while( true ) {
    local_1e1 = 0;
    if (local_72 == false) {
      local_1e1 = local_73;
    }
    if ((local_1e1 & 1) == 0) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffd60,
                        CONCAT17(in_stack_fffffffffffffd5f,
                                 CONCAT16(in_stack_fffffffffffffd5e,
                                          CONCAT15(in_stack_fffffffffffffd5d,
                                                   CONCAT14(in_stack_fffffffffffffd5c,
                                                            in_stack_fffffffffffffd58)))));
    if (*pvVar4 == local_18) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      vVar1 = local_1c;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffd60,
                          CONCAT17(in_stack_fffffffffffffd5f,
                                   CONCAT16(in_stack_fffffffffffffd5e,
                                            CONCAT15(in_stack_fffffffffffffd5d,
                                                     CONCAT14(in_stack_fffffffffffffd5c,
                                                              in_stack_fffffffffffffd58)))));
      *pvVar4 = vVar1;
      local_d4 = BayesianGameBase::IndividualToJointTypeIndices
                           (in_stack_fffffffffffffd60,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT17(in_stack_fffffffffffffd5f,
                                     CONCAT16(in_stack_fffffffffffffd5e,
                                              CONCAT15(in_stack_fffffffffffffd5d,
                                                       CONCAT14(in_stack_fffffffffffffd5c,
                                                                in_stack_fffffffffffffd58)))));
      local_d8 = BayesianGameBase::IndividualToJointTypeIndices
                           (in_stack_fffffffffffffd60,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT17(in_stack_fffffffffffffd5f,
                                     CONCAT16(in_stack_fffffffffffffd5e,
                                              CONCAT15(in_stack_fffffffffffffd5d,
                                                       CONCAT14(in_stack_fffffffffffffd5c,
                                                                in_stack_fffffffffffffd58)))));
      local_e0 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_d4);
      local_e8 = (double)(**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_d8);
      local_f0 = local_e0 / local_40;
      local_f8 = local_e8 / local_48;
      bVar2 = Globals::EqualProbability
                        ((double)in_stack_fffffffffffffd60,
                         (double)CONCAT17(in_stack_fffffffffffffd5f,
                                          CONCAT16(in_stack_fffffffffffffd5e,
                                                   CONCAT15(in_stack_fffffffffffffd5d,
                                                            CONCAT14(in_stack_fffffffffffffd5c,
                                                                     in_stack_fffffffffffffd58)))));
      if (!bVar2) {
        local_73 = 0;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    }
    local_72 = IndexTools::Increment(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  if ((local_73 & 1) == 0) {
    local_1 = 0;
  }
  else {
    (**(code **)(*(long *)(in_RDI + 0x20) + 0x18))(in_RDI + 0x20);
    local_11c = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bf2b2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
               ,in_stack_fffffffffffffd68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8bf305);
    local_72 = false;
    local_11e = 1;
    while( true ) {
      local_231 = 0;
      if (local_72 == false) {
        local_231 = local_11e;
      }
      if ((local_231 & 1) == 0) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffd60,
                          CONCAT17(in_stack_fffffffffffffd5f,
                                   CONCAT16(in_stack_fffffffffffffd5e,
                                            CONCAT15(in_stack_fffffffffffffd5d,
                                                     CONCAT14(in_stack_fffffffffffffd5c,
                                                              in_stack_fffffffffffffd58)))));
      if (*pvVar4 == local_18) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        in_stack_fffffffffffffdb4 = local_1c;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,
                                     CONCAT16(in_stack_fffffffffffffd5e,
                                              CONCAT15(in_stack_fffffffffffffd5d,
                                                       CONCAT14(in_stack_fffffffffffffd5c,
                                                                in_stack_fffffffffffffd58)))));
        *pvVar4 = in_stack_fffffffffffffdb4;
        in_stack_fffffffffffffdb0 =
             BayesianGameBase::IndividualToJointTypeIndices
                       (in_stack_fffffffffffffd60,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT17(in_stack_fffffffffffffd5f,
                                 CONCAT16(in_stack_fffffffffffffd5e,
                                          CONCAT15(in_stack_fffffffffffffd5d,
                                                   CONCAT14(in_stack_fffffffffffffd5c,
                                                            in_stack_fffffffffffffd58)))));
        local_13c = in_stack_fffffffffffffdb0;
        in_stack_fffffffffffffdac =
             BayesianGameBase::IndividualToJointTypeIndices
                       (in_stack_fffffffffffffd60,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT17(in_stack_fffffffffffffd5f,
                                 CONCAT16(in_stack_fffffffffffffd5e,
                                          CONCAT15(in_stack_fffffffffffffd5d,
                                                   CONCAT14(in_stack_fffffffffffffd5c,
                                                            in_stack_fffffffffffffd58)))));
        local_140 = in_stack_fffffffffffffdac;
        ppJVar5 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                              *)in_stack_fffffffffffffd60,
                             CONCAT17(in_stack_fffffffffffffd5f,
                                      CONCAT16(in_stack_fffffffffffffd5e,
                                               CONCAT15(in_stack_fffffffffffffd5d,
                                                        CONCAT14(in_stack_fffffffffffffd5c,
                                                                 in_stack_fffffffffffffd58)))));
        local_148 = *ppJVar5;
        in_stack_fffffffffffffd98 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                       ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                        in_stack_fffffffffffffd60,
                        CONCAT17(in_stack_fffffffffffffd5f,
                                 CONCAT16(in_stack_fffffffffffffd5e,
                                          CONCAT15(in_stack_fffffffffffffd5d,
                                                   CONCAT14(in_stack_fffffffffffffd5c,
                                                            in_stack_fffffffffffffd58)))));
        local_150 = (value_type)
                    (in_stack_fffffffffffffd98->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        if ((local_148 != (value_type)0x0) && (local_150 != (value_type)0x0)) {
          in_stack_fffffffffffffd90 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_13c);
          bVar2 = Globals::EqualProbability
                            ((double)in_stack_fffffffffffffd60,
                             (double)CONCAT17(in_stack_fffffffffffffd5f,
                                              CONCAT16(in_stack_fffffffffffffd5e,
                                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                                         in_stack_fffffffffffffd58))
                                                      )));
          if (!bVar2) {
            (**(code **)(*(long *)(in_RDI + 0x20) + 0x68))(in_RDI + 0x20,local_140);
            bVar2 = Globals::EqualProbability
                              ((double)in_stack_fffffffffffffd60,
                               (double)CONCAT17(in_stack_fffffffffffffd5f,
                                                CONCAT16(in_stack_fffffffffffffd5e,
                                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                                  CONCAT14(in_stack_fffffffffffffd5c
                                                                           ,
                                                  in_stack_fffffffffffffd58)))));
            if (!bVar2) {
              (**(code **)(*(long *)((long)&local_148->field_0x0 +
                                    *(long *)((long)*local_148 + -0xb8)) + 0x98))
                        (local_160,(long)&local_148->field_0x0 + *(long *)((long)*local_148 + -0xb8)
                        );
              (**(code **)(*(long *)((long)&local_150->field_0x0 +
                                    *(long *)((long)*local_150 + -0xb8)) + 0x98))
                        (local_170,(long)&local_150->field_0x0 + *(long *)((long)*local_150 + -0xb8)
                        );
              do {
                IVar3 = BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8bf595);
                in_stack_fffffffffffffd74 =
                     BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8bf5a8);
                if (IVar3 == in_stack_fffffffffffffd74) {
                  BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8bf656);
                  in_stack_fffffffffffffd60 =
                       (BayesianGameBase *)
                       BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8bf67a);
                  in_stack_fffffffffffffd5f =
                       Globals::EqualProbability
                                 ((double)in_stack_fffffffffffffd60,
                                  (double)CONCAT17(in_stack_fffffffffffffd5f,
                                                   CONCAT16(in_stack_fffffffffffffd5e,
                                                            CONCAT15(in_stack_fffffffffffffd5d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd5c,
                                                  in_stack_fffffffffffffd58)))));
                  if (!(bool)in_stack_fffffffffffffd5f) {
                    local_11e = 0;
                  }
                }
                else {
                  local_11e = 0;
                }
                in_stack_fffffffffffffd5e = false;
                if ((local_11e & 1) != 0) {
                  in_stack_fffffffffffffd5d =
                       BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8bf6e1);
                  in_stack_fffffffffffffd5e = false;
                  if ((bool)in_stack_fffffffffffffd5d) {
                    in_stack_fffffffffffffd5c =
                         BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8bf705);
                    in_stack_fffffffffffffd5e = in_stack_fffffffffffffd5c;
                  }
                }
              } while ((bool)in_stack_fffffffffffffd5e != false);
              BeliefIteratorGeneric::~BeliefIteratorGeneric
                        ((BeliefIteratorGeneric *)in_stack_fffffffffffffd60);
              BeliefIteratorGeneric::~BeliefIteratorGeneric
                        ((BeliefIteratorGeneric *)in_stack_fffffffffffffd60);
            }
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
      local_72 = IndexTools::Increment(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd58 = CONCAT13(local_72,(int3)in_stack_fffffffffffffd58);
    }
    if (((local_73 & 1) == 0) || ((local_11e & 1) == 0)) {
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
  }
  local_fc = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  return (bool)(local_1 & 1);
}

Assistant:

bool BayesianGameWithClusterInfo::TestExactEquivalence(Index agI, Index t1, Index t2) const
{
    //looping over all joint type profiles of the other agents
    //( over all type_{-i} ) is inconvenient.
    //Rather we loop over all joint types in this function
    
    //we start with the individual type vector corr. to joint type 0
    //(i.e., the vector with type index 0 for each agent).
    vector<Index> typeIndices;

    //first we compute the marginals P(t1) and P(t2)
    double p1, p2;
    p1 = p2 = 0.0;    
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    bool equalProb=true;

    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            p1 += GetProbability(jtI1);
            p2 += GetProbability(jtI2);
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }



    //now we compare P(type{-i} | t1) =? P(type{-i} | t2)
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    while( !finished && equalProb )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            //cout << "Comparing jtI1="<<jtI1<<"="
                //<<SoftPrintVector(typeIndices);
            //cout << "and jtI2="<<jtI2<<"="
                //<<SoftPrintVector(typeIndices2) << endl;
            double pjt1 =  GetProbability(jtI1);
            double pjt2 =  GetProbability(jtI2);
            double conditional_pjt1 = pjt1 / p1;
            double conditional_pjt2 = pjt2 / p2;
            //cout << "p1="<<p1
                //<<"\t,pjt1="<<pjt1
                //<<"\t,cpjt1="<<conditional_pjt1
                //<<"\np2="<<p2
                //<<"\t,pjt2="<<pjt2
                //<<"\t,cpjt2="<<conditional_pjt2
                //<<endl;
            if(! Globals::EqualProbability(conditional_pjt1,conditional_pjt2 ) )
            {
                equalProb=false;
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if !BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    // if we want to check why two types are not equivalent, we also
    // need the second test, otherwise we can stop here
    if(!equalProb)
        return(false);
#endif

    //now we compare P(s, type{-i} | t1) =? P(s, type{-i} | t2)
    //or, actually we check that P(s |  type{-i}, t1) =? P(s | type{-i} , t2) 
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    bool equalJB=true;
    while( !finished && equalJB )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            JointBeliefInterface* jb1 = _m_JBs.at(jtI1);
            JointBeliefInterface* jb2 = _m_JBs.at(jtI2);
            // only do this test if the joint beliefs actually exist
            // (they may not in case the joint type has prob 0)
            if(jb1!=0 && jb2!=0 &&
               // If they exist, we still need to check whether can
               // actually occur!
               // In the old code (used for AAMAS09), this check was
               // missing, which is why the recycling problem
               // clustered to 9 JT there, instead of 4 now.
               !Globals::EqualProbability(GetProbability(jtI1),0.0) &&
               !Globals::EqualProbability(GetProbability(jtI2),0.0))
            {
                BeliefIteratorGeneric bit1 = jb1->GetIterator();
                BeliefIteratorGeneric bit2 = jb2->GetIterator();
                do
                {
                    // as the belief can be sparse, we also need to
                    // make sure the iterators point to the same state
                    // index, otherwise beliefs like [0 0 1 0] and [0
                    // 1 0 0] are considered equal
                    if(bit1.GetStateIndex() !=
                       bit2.GetStateIndex())
                        equalJB = false;
                    else
                    {
                        double p1 = bit1.GetProbability();
                        double p2 = bit2.GetProbability();
                        if(! Globals::EqualProbability(p1,p2) )
                            equalJB=false;
                    }
                }
                while(equalJB && bit1.Next() && bit2.Next());
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    if(!equalProb && !equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent both" << endl;
    else if(!equalProb)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent prob" << endl;
    else if(!equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent belief" << endl;
    else
        cout << "TESTEQUIVALENCE " << GetStage() << " equivalent" << endl;
#endif

    if(equalProb && equalJB)
        return(true);
    else
        return(false);
}